

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# conditional_entropy.c
# Opt level: O3

double inform_conditional_entropy(int *xs,int *ys,size_t n,int bx,int by,inform_error *err)

{
  uint32_t *puVar1;
  uint32_t *puVar2;
  _Bool _Var3;
  inform_dist *dist;
  inform_dist *joint;
  size_t sVar4;
  double dVar5;
  
  _Var3 = check_arguments(xs,ys,n,bx,by,err);
  if (!_Var3) {
    dist = inform_dist_alloc((long)bx);
    if (dist != (inform_dist *)0x0) {
      joint = inform_dist_alloc((long)(bx * by));
      if (joint != (inform_dist *)0x0) {
        dist->counts = n;
        joint->counts = n;
        if (n != 0) {
          puVar1 = dist->histogram;
          puVar2 = joint->histogram;
          sVar4 = 0;
          do {
            puVar1[xs[sVar4]] = puVar1[xs[sVar4]] + 1;
            puVar2[(long)ys[sVar4] + (long)xs[sVar4] * (long)by] =
                 puVar2[(long)ys[sVar4] + (long)xs[sVar4] * (long)by] + 1;
            sVar4 = sVar4 + 1;
          } while (n != sVar4);
        }
        dVar5 = inform_shannon_ce(joint,dist,2.0);
        inform_dist_free(dist);
        inform_dist_free(joint);
        return dVar5;
      }
      inform_dist_free(dist);
    }
    if (err != (inform_error *)0x0) {
      *err = INFORM_ENOMEM;
    }
  }
  return NAN;
}

Assistant:

double inform_conditional_entropy(int const *xs, int const *ys, size_t n,
    int bx, int by, inform_error *err)
{
    if (check_arguments(xs, ys, n, bx, by, err)) return NAN;

    inform_dist *x = NULL, *xy = NULL;
    if (allocate(bx, by, &x, &xy, err)) return NAN;

    accumulate(xs, ys, n, by, x, xy);

    double ce = inform_shannon_ce(xy, x, 2.0);

    free_all(&x, &xy);

    return ce;
}